

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O3

void __thiscall cmFileCopier::NotBeforeMatch(cmFileCopier *this,string *arg)

{
  cmExecutionStatus *pcVar1;
  ostream *poVar2;
  ostringstream e;
  long *local_1b0;
  long local_1a0 [2];
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"option ",7);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(arg->_M_dataplus)._M_p,arg->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2," may not appear before PATTERN or REGEX.",0x28);
  pcVar1 = this->Status;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  this->Doing = 1;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return;
}

Assistant:

void cmFileCopier::NotBeforeMatch(std::string const& arg)
{
  std::ostringstream e;
  e << "option " << arg << " may not appear before PATTERN or REGEX.";
  this->Status.SetError(e.str());
  this->Doing = DoingError;
}